

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap-types.cpp
# Opt level: O0

void __thiscall wasm::anon_unknown_24::Inhabitator::markBottomRefsNullable(Inhabitator *this)

{
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *this_00;
  value_type vVar1;
  bool bVar2;
  reference pHVar3;
  size_type sVar4;
  reference pvVar5;
  FieldPos field;
  bool local_92;
  undefined1 local_80 [12];
  HeapType local_70 [3];
  Type local_58;
  value_type child;
  size_t i;
  vector<wasm::Type,_std::allocator<wasm::Type>_> children;
  HeapType type;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *__range2;
  Inhabitator *this_local;
  
  this_00 = this->types;
  __end2 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::begin(this_00);
  type.id = (uintptr_t)std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::end(this_00);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
                                     *)&type), bVar2) {
    pHVar3 = __gnu_cxx::
             __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
             ::operator*(&__end2);
    children.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)pHVar3->id;
    bVar2 = HeapType::isSignature
                      ((HeapType *)
                       &children.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl
                        .super__Vector_impl_data._M_end_of_storage);
    if (!bVar2) {
      wasm::HeapType::getTypeChildren();
      for (child.id = 0; vVar1.id = child.id,
          sVar4 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size
                            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&i),
          vVar1.id < sVar4; child.id = child.id + 1) {
        pvVar5 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::operator[]
                           ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&i,child.id);
        local_58.id = pvVar5->id;
        bVar2 = Type::isRef(&local_58);
        local_92 = false;
        if (bVar2) {
          local_70[0] = Type::getHeapType(&local_58);
          bVar2 = HeapType::isBottom(local_70);
          local_92 = false;
          if (bVar2) {
            local_92 = Type::isNonNullable(&local_58);
          }
        }
        if (local_92 != false) {
          std::pair<wasm::HeapType,_unsigned_int>::pair<wasm::HeapType_&,_unsigned_long_&,_true>
                    ((pair<wasm::HeapType,_unsigned_int> *)local_80,
                     (HeapType *)
                     &children.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage,&child.id);
          field._12_4_ = 0;
          field.first.id = local_80._0_8_;
          field.second = local_80._8_4_;
          markNullable(this,field);
        }
      }
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::~vector
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&i);
    }
    __gnu_cxx::
    __normal_iterator<const_wasm::HeapType_*,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void Inhabitator::markBottomRefsNullable() {
  for (auto type : types) {
    if (type.isSignature()) {
      // Functions can always be instantiated, even if their types refer to
      // uninhabitable types.
      continue;
    }
    auto children = type.getTypeChildren();
    for (size_t i = 0; i < children.size(); ++i) {
      auto child = children[i];
      if (child.isRef() && child.getHeapType().isBottom() &&
          child.isNonNullable()) {
        markNullable({type, i});
      }
    }
  }
}